

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O0

int run_helper_tcp6_echo_server(void)

{
  int iVar1;
  undefined4 local_c;
  
  loop = uv_default_loop();
  iVar1 = tcp6_echo_start(0x23a3);
  if (iVar1 == 0) {
    notify_parent_process();
    uv_run(loop,UV_RUN_DEFAULT);
  }
  local_c = (uint)(iVar1 != 0);
  return local_c;
}

Assistant:

HELPER_IMPL(tcp6_echo_server) {
  loop = uv_default_loop();

  if (tcp6_echo_start(TEST_PORT))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}